

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O3

SUNErrCode SUNLinSol_SPFGMRSetPrecType(SUNLinearSolver S,int pretype)

{
  *(uint *)((long)S->content + 4) = (uint)(pretype - 1U < 3) * 2;
  return 0;
}

Assistant:

SUNErrCode SUNLinSol_SPFGMRSetPrecType(SUNLinearSolver S, int pretype)
{
  /* Check for legal pretype */
  pretype = ((pretype == SUN_PREC_LEFT) || (pretype == SUN_PREC_RIGHT) ||
             (pretype == SUN_PREC_BOTH))
              ? SUN_PREC_RIGHT
              : SUN_PREC_NONE;

  /* Set pretype */
  SPFGMR_CONTENT(S)->pretype = pretype;
  return SUN_SUCCESS;
}